

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlDeclaration::Clone(TiXmlDeclaration *this)

{
  TiXmlDeclaration *this_00;
  
  this_00 = (TiXmlDeclaration *)operator_new(0x68);
  TiXmlDeclaration(this_00);
  CopyTo(this,this_00);
  return &this_00->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlDeclaration::Clone() const {
	TiXmlDeclaration* clone = new TiXmlDeclaration();

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}